

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_machine_playground.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  string sStack_448;
  inputs_type inputs;
  SM sm;
  
  std::operator<<((ostream *)&std::cout,"--- state_machine playground ---\n");
  estl::state_machine<cd_fsm_def>::state_machine(&sm);
  poVar1 = std::operator<<((ostream *)&std::cout,"states_count() : ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"current state  : ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sm.state_);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"tv1.size()      : ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"\n");
  estl::state_machine<cd_fsm_def>::test_transitions(&sm,&tv1,true);
  poVar1 = std::operator<<((ostream *)&std::cout,"sm.test_transitions(tv1):");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::operator<<(poVar1,"\n");
  inputs.time.__d.__r = (duration)0;
  inputs.bay_closed = closed;
  inputs.stop = none;
  inputs.eject = none;
  inputs.power_toggle = none;
  sm.state_ = closed;
  inputs.play_pause = none;
  inputs.has_disc = active;
  estl::state_machine<cd_fsm_def>::execute_actions(&sm,&inputs);
  cd_fsm_def::outputs_type::debug_str_abi_cxx11_(&sStack_448,&sm.outputs_);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&sStack_448);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&sStack_448);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  estl::state_machine<cd_fsm_def>::~state_machine(&sm);
  return 0;
}

Assistant:

int main()
{
    cout << "--- state_machine playground ---\n";
    SM sm;
    cout << "states_count() : " << sm.states_count() << "\n";
    cout << "current state  : " << sm.state_int() << "\n";
    cout << "tv1.size()      : " << tv1.size() << "\n";
    const auto all_ok = sm.test_transitions(tv1, true);
    cout << "sm.test_transitions(tv1):" << all_ok << "\n";


    SM::inputs_type inputs;
    sm.state_set(state_type::closed);
    inputs.has_disc = has_disc_sig::active;
    sm.execute_actions(inputs);


    cout << sm.outputs().debug_str()
         << endl;

    cout << endl;
    return 0;
}